

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O1

void __thiscall chatra::Reader::add(Reader *this,MethodTable *methodTable)

{
  _Fwd_list_node_base *p_Var1;
  Node *local_30;
  MethodTable *local_28;
  MethodTable *methodTable_local;
  
  local_28 = methodTable;
  if (methodTable->source == InnerFunctions) {
    local_30 = methodTable->sourceNodePtr;
    std::
    _Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::MethodTable_const*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<chatra::Node*,chatra::MethodTable_const*&>
              ((_Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::MethodTable_const*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->nodeMethodTableMap,&local_30,&local_28);
  }
  p_Var1 = (local_28->methods).super__Fwd_list_base<chatra::Method,_std::allocator<chatra::Method>_>
           ._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    do {
      local_30 = (Node *)(p_Var1 + 1);
      if (p_Var1[1]._M_next != (_Fwd_list_node_base *)0x0) {
        std::
        _Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::Method_const*>,std::allocator<std::pair<chatra::Node*const,chatra::Method_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<chatra::Node*const&,chatra::Method_const*&>
                  ((_Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::Method_const*>,std::allocator<std::pair<chatra::Node*const,chatra::Method_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->nodeMethodMap,local_30,&local_30);
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_Fwd_list_node_base *)0x0);
  }
  return;
}

Assistant:

void Reader::add(const MethodTable* methodTable) {
	if (methodTable->getSource() == MethodTable::Source::InnerFunctions)
		nodeMethodTableMap.emplace(methodTable->sourceNode(), methodTable);
	methodTable->forEach([&](const Method& method) {
		add(&method);
	});
}